

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O0

double compute_error(vec *last_layer,int nx)

{
  int __x;
  double extraout_XMM0_Qa;
  double current_error;
  int i;
  double h;
  double max_error;
  int nx_local;
  vec *last_layer_local;
  vec *pvVar1;
  
  h = 0.0;
  for (current_error._4_4_ = 0; current_error._4_4_ < nx + -1;
      current_error._4_4_ = current_error._4_4_ + 1) {
    pvVar1 = last_layer;
    std::vector<double,_std::allocator<double>_>::operator[](last_layer,(long)current_error._4_4_);
    __x = (int)pvVar1;
    exact_solution((0.7853981633974483 / (double)nx) * (double)(current_error._4_4_ + 1),1.0);
    std::abs(__x);
    if (h < extraout_XMM0_Qa) {
      h = extraout_XMM0_Qa;
    }
  }
  return h;
}

Assistant:

double compute_error(const vec& last_layer, int nx)
{
    double max_error = 0.0;
    double h = X / nx;

    for (int i = 0; i < nx - 1; i++)
    {
        double current_error =
            std::abs(last_layer[i] - exact_solution(h * (i + 1), T));
        if (current_error > max_error)
        {
            max_error = current_error;
        }
    }

    return max_error;
}